

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_unrolled_binary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,bool negate,BaseType expected_type)

{
  uint uVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  uint32_t id;
  bool local_405;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [40];
  undefined1 local_318 [4];
  uint32_t i;
  string expr;
  SPIRType *type;
  undefined1 local_2e0 [8];
  SPIRType target_type1;
  SPIRType target_type0;
  SPIRType *type1;
  SPIRType *type0;
  bool negate_local;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op1);
  SPIRType::SPIRType((SPIRType *)&target_type1.member_name_cache._M_h._M_single_bucket,pSVar3);
  SPIRType::SPIRType((SPIRType *)local_2e0,pSVar4);
  target_type1.super_IVariant._vptr_IVariant._4_4_ = expected_type;
  target_type1.super_IVariant._12_4_ = 1;
  pSVar5 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_318,(SPIRType *)this);
  ::std::__cxx11::string::operator+=((string *)local_318,'(');
  for (local_340._36_4_ = 0; (uint)local_340._36_4_ < pSVar5->vecsize;
      local_340._36_4_ = local_340._36_4_ + 1) {
    if (negate) {
      ::std::__cxx11::string::operator+=((string *)local_318,"!(");
    }
    id = (uint32_t)this;
    if ((expected_type == Unknown) ||
       (*(BaseType *)&(pSVar3->super_IVariant).field_0xc == expected_type)) {
      to_extract_component_expression_abi_cxx11_((CompilerGLSL *)local_380,id,op0);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)local_380);
      ::std::__cxx11::string::~string((string *)local_380);
    }
    else {
      uVar1 = *(uint *)&(pSVar3->super_IVariant).field_0xc;
      to_extract_component_expression_abi_cxx11_((CompilerGLSL *)local_360,id,op0);
      bitcast_expression((CompilerGLSL *)local_340,(SPIRType *)this,(int)&target_type1 + 0x148,
                         (string *)(ulong)uVar1);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)local_340);
      ::std::__cxx11::string::~string((string *)local_340);
      ::std::__cxx11::string::~string((string *)local_360);
    }
    ::std::__cxx11::string::operator+=((string *)local_318,' ');
    ::std::__cxx11::string::operator+=((string *)local_318,op);
    ::std::__cxx11::string::operator+=((string *)local_318,' ');
    if ((expected_type == Unknown) ||
       (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == expected_type)) {
      to_extract_component_expression_abi_cxx11_((CompilerGLSL *)local_3e0,id,op1);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)local_3e0);
      ::std::__cxx11::string::~string((string *)local_3e0);
    }
    else {
      uVar1 = *(uint *)&(pSVar4->super_IVariant).field_0xc;
      to_extract_component_expression_abi_cxx11_((CompilerGLSL *)local_3c0,id,op1);
      bitcast_expression((CompilerGLSL *)local_3a0,(SPIRType *)this,(BaseType)local_2e0,
                         (string *)(ulong)uVar1);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)local_3a0);
      ::std::__cxx11::string::~string((string *)local_3a0);
      ::std::__cxx11::string::~string((string *)local_3c0);
    }
    if (negate) {
      ::std::__cxx11::string::operator+=((string *)local_318,")");
    }
    if (local_340._36_4_ + 1 < pSVar5->vecsize) {
      ::std::__cxx11::string::operator+=((string *)local_318,", ");
    }
  }
  ::std::__cxx11::string::operator+=((string *)local_318,')');
  bVar2 = should_forward(this,op0);
  local_405 = false;
  if (bVar2) {
    local_405 = should_forward(this,op1);
  }
  emit_op(this,result_type,result_id,(string *)local_318,local_405,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  ::std::__cxx11::string::~string((string *)local_318);
  SPIRType::~SPIRType((SPIRType *)local_2e0);
  SPIRType::~SPIRType((SPIRType *)&target_type1.member_name_cache._M_h._M_single_bucket);
  return;
}

Assistant:

void CompilerGLSL::emit_unrolled_binary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           const char *op, bool negate, SPIRType::BaseType expected_type)
{
	auto &type0 = expression_type(op0);
	auto &type1 = expression_type(op1);

	SPIRType target_type0 = type0;
	SPIRType target_type1 = type1;
	target_type0.basetype = expected_type;
	target_type1.basetype = expected_type;
	target_type0.vecsize = 1;
	target_type1.vecsize = 1;

	auto &type = get<SPIRType>(result_type);
	auto expr = type_to_glsl_constructor(type);
	expr += '(';
	for (uint32_t i = 0; i < type.vecsize; i++)
	{
		// Make sure to call to_expression multiple times to ensure
		// that these expressions are properly flushed to temporaries if needed.
		if (negate)
			expr += "!(";

		if (expected_type != SPIRType::Unknown && type0.basetype != expected_type)
			expr += bitcast_expression(target_type0, type0.basetype, to_extract_component_expression(op0, i));
		else
			expr += to_extract_component_expression(op0, i);

		expr += ' ';
		expr += op;
		expr += ' ';

		if (expected_type != SPIRType::Unknown && type1.basetype != expected_type)
			expr += bitcast_expression(target_type1, type1.basetype, to_extract_component_expression(op1, i));
		else
			expr += to_extract_component_expression(op1, i);

		if (negate)
			expr += ")";

		if (i + 1 < type.vecsize)
			expr += ", ";
	}
	expr += ')';
	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}